

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::basic_json_encoder
          (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *sink,basic_json_encode_options<char> *options,allocator<char> *alloc)

{
  spaces_option sVar1;
  uint3 *local_80;
  undefined8 local_78;
  uint3 local_70 [4];
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  write_double *local_40;
  basic_json_encode_options<char> *local_38;
  
  (this->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_json_encoder_0099ad60;
  (this->sink_).buf_ptr = (container_type *)0x0;
  (this->sink_).buf_ptr = sink->buf_ptr;
  sink->buf_ptr = (container_type *)0x0;
  local_38 = &this->options_;
  basic_json_encode_options<char>::basic_json_encode_options(local_38,options);
  local_40 = &this->fp_;
  detail::write_double::write_double(local_40,options->float_format_,(int)options->precision_);
  this->column_ = 0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->colon_str_)._M_dataplus._M_p = (pointer)&(this->colon_str_).field_2;
  (this->colon_str_)._M_string_length = 0;
  (this->colon_str_).field_2._M_local_buf[0] = '\0';
  (this->comma_str_)._M_dataplus._M_p = (pointer)&(this->comma_str_).field_2;
  (this->comma_str_)._M_string_length = 0;
  (this->comma_str_).field_2._M_local_buf[0] = '\0';
  (this->open_object_brace_str_)._M_dataplus._M_p = (pointer)&(this->open_object_brace_str_).field_2
  ;
  (this->open_object_brace_str_)._M_string_length = 0;
  (this->open_object_brace_str_).field_2._M_local_buf[0] = '\0';
  (this->close_object_brace_str_)._M_dataplus._M_p =
       (pointer)&(this->close_object_brace_str_).field_2;
  (this->close_object_brace_str_)._M_string_length = 0;
  (this->close_object_brace_str_).field_2._M_local_buf[0] = '\0';
  (this->open_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->open_array_bracket_str_).field_2;
  (this->open_array_bracket_str_)._M_string_length = 0;
  local_48 = (string *)&this->open_object_brace_str_;
  local_50 = (string *)&this->close_object_brace_str_;
  (this->open_array_bracket_str_).field_2._M_local_buf[0] = '\0';
  (this->close_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->close_array_bracket_str_).field_2;
  (this->close_array_bracket_str_)._M_string_length = 0;
  (this->close_array_bracket_str_).field_2._M_local_buf[0] = '\0';
  this->nesting_depth_ = 0;
  local_58 = (string *)&this->open_array_bracket_str_;
  local_60 = (string *)&this->close_array_bracket_str_;
  sVar1 = options->spaces_around_colon_;
  if (sVar1 == space_after) {
    local_70[0]._0_2_ = 0x203a;
LAB_00213fd2:
    local_78 = 2;
    local_70[0] = (uint3)(ushort)local_70[0];
LAB_00213fde:
    local_80 = local_70;
    std::__cxx11::string::operator=((string *)&this->colon_str_,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    if (sVar1 == space_before) {
      local_70[0]._0_2_ = 0x3a20;
      goto LAB_00213fd2;
    }
    if (sVar1 == space_before_and_after) {
      local_70[0]._0_4_ = 0x203a20;
      local_78 = 3;
      goto LAB_00213fde;
    }
    std::__cxx11::string::push_back((char)&this->colon_str_);
  }
  sVar1 = options->spaces_around_comma_;
  if (sVar1 == space_before_and_after) {
    local_70[0]._0_4_ = 0x202c20;
    local_78 = 3;
  }
  else {
    if (sVar1 == space_before) {
      local_70[0]._0_2_ = 0x2c20;
    }
    else {
      if (sVar1 != space_after) {
        std::__cxx11::string::push_back((char)&this->comma_str_);
        goto LAB_00214088;
      }
      local_70[0]._0_2_ = 0x202c;
    }
    local_78 = 2;
    local_70[0] = (uint3)(ushort)local_70[0];
  }
  local_80 = local_70;
  std::__cxx11::string::operator=((string *)&this->comma_str_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
LAB_00214088:
  if ((options->field_0x8 & 4) == 0) {
    std::__cxx11::string::push_back((char)local_48);
    std::__cxx11::string::push_back((char)local_50);
  }
  else {
    local_78 = 2;
    local_70[0] = 0x207b;
    local_80 = local_70;
    std::__cxx11::string::operator=(local_48,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    local_78 = 2;
    local_70[0] = 0x7d20;
    local_80 = local_70;
    std::__cxx11::string::operator=(local_50,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((options->field_0x8 & 8) == 0) {
    std::__cxx11::string::push_back((char)local_58);
    std::__cxx11::string::push_back((char)local_60);
  }
  else {
    local_78 = 2;
    local_70[0] = 0x205b;
    local_80 = local_70;
    std::__cxx11::string::operator=(local_58,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    local_78 = 2;
    local_70[0] = 0x5d20;
    local_80 = local_70;
    std::__cxx11::string::operator=(local_60,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

basic_json_encoder(Sink&& sink, 
                           const basic_json_encode_options<CharT>& options, 
                           const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)), 
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc)
        {
            switch (options.spaces_around_colon())
            {
                case spaces_option::space_after:
                    colon_str_ = std::basic_string<CharT>({':',' '});
                    break;
                case spaces_option::space_before:
                    colon_str_ = std::basic_string<CharT>({' ',':'});
                    break;
                case spaces_option::space_before_and_after:
                    colon_str_ = std::basic_string<CharT>({' ',':',' '});
                    break;
                default:
                    colon_str_.push_back(':');
                    break;
            }
            switch (options.spaces_around_comma())
            {
                case spaces_option::space_after:
                    comma_str_ = std::basic_string<CharT>({',',' '});
                    break;
                case spaces_option::space_before:
                    comma_str_ = std::basic_string<CharT>({' ',','});
                    break;
                case spaces_option::space_before_and_after:
                    comma_str_ = std::basic_string<CharT>({' ',',',' '});
                    break;
                default:
                    comma_str_.push_back(',');
                    break;
            }
            if (options.pad_inside_object_braces())
            {
                open_object_brace_str_ = std::basic_string<CharT>({'{', ' '});
                close_object_brace_str_ = std::basic_string<CharT>({' ', '}'});
            }
            else
            {
                open_object_brace_str_.push_back('{');
                close_object_brace_str_.push_back('}');
            }
            if (options.pad_inside_array_brackets())
            {
                open_array_bracket_str_ = std::basic_string<CharT>({'[', ' '});
                close_array_bracket_str_ = std::basic_string<CharT>({' ', ']'});
            }
            else
            {
                open_array_bracket_str_.push_back('[');
                close_array_bracket_str_.push_back(']');
            }
        }